

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsInterface.cpp
# Opt level: O2

HighsStatus __thiscall Highs::basisForSolution(Highs *this)

{
  vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_> *pvVar1;
  double dVar2;
  double dVar3;
  HighsStatus HVar4;
  long lVar5;
  uint uVar6;
  HighsInt iCol;
  long lVar7;
  HighsInt iRow;
  ulong uVar8;
  allocator local_b1;
  string local_b0;
  HighsBasis basis;
  
  invalidateBasis(this);
  HighsBasis::HighsBasis(&basis);
  pvVar1 = &basis.col_status;
  uVar6 = 0;
  for (lVar7 = 0; lVar7 < (this->model_).lp_.num_col_; lVar7 = lVar7 + 1) {
    dVar2 = (this->solution_).col_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7];
    dVar3 = (this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
    if (ABS((this->model_).lp_.col_lower_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7] - dVar2) <= dVar3) {
      local_b0._M_dataplus._M_p._0_1_ = 0;
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
      emplace_back<HighsBasisStatus>(pvVar1,(HighsBasisStatus *)&local_b0);
    }
    else if (ABS((this->model_).lp_.col_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar7] - dVar2) <= dVar3) {
      local_b0._M_dataplus._M_p._0_1_ = 2;
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
      emplace_back<HighsBasisStatus>(pvVar1,(HighsBasisStatus *)&local_b0);
    }
    else {
      local_b0._M_dataplus._M_p._0_1_ = 1;
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
      emplace_back<HighsBasisStatus>(pvVar1,(HighsBasisStatus *)&local_b0);
      uVar6 = uVar6 + 1;
    }
  }
  pvVar1 = &basis.row_status;
  lVar7 = 0;
  uVar8 = (ulong)uVar6;
  while( true ) {
    lVar5 = (long)(this->model_).lp_.num_row_;
    if (lVar5 <= lVar7) break;
    dVar2 = (this->solution_).row_value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[lVar7];
    dVar3 = (this->options_).super_HighsOptionsStruct.primal_feasibility_tolerance;
    if (ABS((this->model_).lp_.row_lower_.super__Vector_base<double,_std::allocator<double>_>.
            _M_impl.super__Vector_impl_data._M_start[lVar7] - dVar2) <= dVar3) {
      local_b0._M_dataplus._M_p._0_1_ = 0;
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
      emplace_back<HighsBasisStatus>(pvVar1,(HighsBasisStatus *)&local_b0);
    }
    else if (ABS((this->model_).lp_.row_upper_.super__Vector_base<double,_std::allocator<double>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar7] - dVar2) <= dVar3) {
      local_b0._M_dataplus._M_p._0_1_ = 2;
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
      emplace_back<HighsBasisStatus>(pvVar1,(HighsBasisStatus *)&local_b0);
    }
    else {
      local_b0._M_dataplus._M_p._0_1_ = 1;
      std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::
      emplace_back<HighsBasisStatus>(pvVar1,(HighsBasisStatus *)&local_b0);
      uVar8 = (ulong)((int)uVar8 + 1);
    }
    lVar7 = lVar7 + 1;
  }
  highsLogDev(&(this->options_).super_HighsOptionsStruct.log_options,kInfo,
              "LP has %d rows and solution yields %d possible basic variables (%d / %d; %d / %d)\n",
              lVar5,uVar8,(ulong)uVar6,(ulong)(uint)(this->model_).lp_.num_col_,
              (ulong)((int)uVar8 - uVar6),lVar5);
  std::__cxx11::string::string((string *)&local_b0,"",&local_b1);
  HVar4 = setBasis(this,&basis,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  HighsBasis::~HighsBasis(&basis);
  return HVar4;
}

Assistant:

HighsStatus Highs::basisForSolution() {
  HighsLp& lp = model_.lp_;
  assert(!lp.isMip() || options_.solve_relaxation);
  assert(solution_.value_valid);
  invalidateBasis();
  HighsInt num_basic = 0;
  HighsBasis basis;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    if (std::fabs(lp.col_lower_[iCol] - solution_.col_value[iCol]) <=
        options_.primal_feasibility_tolerance) {
      basis.col_status.push_back(HighsBasisStatus::kLower);
    } else if (std::fabs(lp.col_upper_[iCol] - solution_.col_value[iCol]) <=
               options_.primal_feasibility_tolerance) {
      basis.col_status.push_back(HighsBasisStatus::kUpper);
    } else {
      num_basic++;
      basis.col_status.push_back(HighsBasisStatus::kBasic);
    }
  }
  const HighsInt num_basic_col = num_basic;
  for (HighsInt iRow = 0; iRow < lp.num_row_; iRow++) {
    if (std::fabs(lp.row_lower_[iRow] - solution_.row_value[iRow]) <=
        options_.primal_feasibility_tolerance) {
      basis.row_status.push_back(HighsBasisStatus::kLower);
    } else if (std::fabs(lp.row_upper_[iRow] - solution_.row_value[iRow]) <=
               options_.primal_feasibility_tolerance) {
      basis.row_status.push_back(HighsBasisStatus::kUpper);
    } else {
      num_basic++;
      basis.row_status.push_back(HighsBasisStatus::kBasic);
    }
  }
  const HighsInt num_basic_row = num_basic - num_basic_col;
  assert((int)basis.col_status.size() == lp.num_col_);
  assert((int)basis.row_status.size() == lp.num_row_);
  highsLogDev(options_.log_options, HighsLogType::kInfo,
              "LP has %d rows and solution yields %d possible basic variables "
              "(%d / %d; %d / %d)\n",
              (int)lp.num_row_, (int)num_basic, (int)num_basic_col,
              (int)lp.num_col_, (int)num_basic_row, (int)lp.num_row_);
  return this->setBasis(basis);
}